

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGGenerateAttributes(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict def)

{
  xmlRelaxNGType xVar1;
  xmlRelaxNGDefinePtr pxVar2;
  int iVar3;
  xmlRelaxNGDefinePtr pxVar4;
  xmlRelaxNGDefinePtr pxVar5;
  
  if (ctxt->nbErrors == 0) {
    iVar3 = 1;
    pxVar2 = def;
LAB_00172d87:
    pxVar4 = pxVar2;
    if (pxVar4 != (xmlRelaxNGDefinePtr_conflict)0x0) {
      xVar1 = pxVar4->type;
      if ((uint)xVar1 < 0x14) {
        if ((0xffc00U >> (xVar1 & (XML_RELAXNG_ONEORMORE|XML_RELAXNG_ZEROORMORE)) & 1) == 0) {
          if ((0x1f9U >> (xVar1 & (XML_RELAXNG_ONEORMORE|XML_RELAXNG_ZEROORMORE)) & 1) != 0) {
            return 0;
          }
          goto LAB_00172dbf;
        }
        pxVar2 = pxVar4->content;
        pxVar5 = pxVar2;
        if (pxVar2 == (xmlRelaxNGDefinePtr)0x0) goto LAB_00172dbf;
        for (; pxVar5 != (xmlRelaxNGDefinePtr)0x0; pxVar5 = pxVar5->next) {
          pxVar5->parent = pxVar4;
        }
      }
      else {
LAB_00172dbf:
        do {
          if (pxVar4 == def) {
            return 1;
          }
          pxVar2 = pxVar4->next;
          if (pxVar4->next != (xmlRelaxNGDefinePtr)0x0) goto LAB_00172d87;
          pxVar4 = pxVar4->parent;
        } while (pxVar4 != (xmlRelaxNGDefinePtr)0x0);
        pxVar2 = (xmlRelaxNGDefinePtr_conflict)0x0;
      }
      goto LAB_00172d87;
    }
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int
xmlRelaxNGGenerateAttributes(xmlRelaxNGParserCtxtPtr ctxt,
                             xmlRelaxNGDefinePtr def)
{
    xmlRelaxNGDefinePtr parent, cur, tmp;

    /*
     * Don't run that check in case of error. Infinite recursion
     * becomes possible.
     */
    if (ctxt->nbErrors != 0)
        return (-1);

    parent = NULL;
    cur = def;
    while (cur != NULL) {
        if ((cur->type == XML_RELAXNG_ELEMENT) ||
            (cur->type == XML_RELAXNG_TEXT) ||
            (cur->type == XML_RELAXNG_DATATYPE) ||
            (cur->type == XML_RELAXNG_PARAM) ||
            (cur->type == XML_RELAXNG_LIST) ||
            (cur->type == XML_RELAXNG_VALUE) ||
            (cur->type == XML_RELAXNG_EMPTY))
            return (0);
        if ((cur->type == XML_RELAXNG_CHOICE) ||
            (cur->type == XML_RELAXNG_INTERLEAVE) ||
            (cur->type == XML_RELAXNG_GROUP) ||
            (cur->type == XML_RELAXNG_ONEORMORE) ||
            (cur->type == XML_RELAXNG_ZEROORMORE) ||
            (cur->type == XML_RELAXNG_OPTIONAL) ||
            (cur->type == XML_RELAXNG_PARENTREF) ||
            (cur->type == XML_RELAXNG_EXTERNALREF) ||
            (cur->type == XML_RELAXNG_REF) ||
            (cur->type == XML_RELAXNG_DEF)) {
            if (cur->content != NULL) {
                parent = cur;
                cur = cur->content;
                tmp = cur;
                while (tmp != NULL) {
                    tmp->parent = parent;
                    tmp = tmp->next;
                }
                continue;
            }
        }
        if (cur == def)
            break;
        if (cur->next != NULL) {
            cur = cur->next;
            continue;
        }
        do {
            cur = cur->parent;
            if (cur == NULL)
                break;
            if (cur == def)
                return (1);
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }
        } while (cur != NULL);
    }
    return (1);
}